

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O2

void __thiscall Lexical::Lexical(Lexical *this,Parsing *parsing_)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_a1;
  int local_a0 [4];
  string local_90;
  Node local_70;
  
  Parsing::Parsing(&this->parsing);
  (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &this->relationOperators;
  (this->relationOperators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->relationOperators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->relationOperators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->procedureTable).super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->procedureTable).super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->procedureTable).super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Node::Node(&this->root);
  this->procedureCnt = 0;
  (this->generator).interCode.super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->generator).interCode.super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->generator).interCode.super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Parsing::operator=(&this->parsing,parsing_);
  std::vector<Word,_std::allocator<Word>_>::operator=(&this->words,&parsing_->words);
  std::__cxx11::string::string((string *)&local_90,"",&local_a1);
  local_a0[3] = 0;
  local_a0[2] = 0;
  local_a0[1] = 0;
  local_a0[0] = 0;
  Word::Word((Word *)&local_70,&local_90,local_a0 + 3,local_a0 + 2,local_a0 + 1,local_a0);
  std::vector<Word,_std::allocator<Word>_>::emplace_back<Word>(&this->words,(Word *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  this->wordIndex = -1;
  this->nodeCnt = 0;
  this->lastErrorIndex = -1;
  this->lastErrorCode = -1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])0x10d131);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])"#");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])"<");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [3])"<=");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [2])">");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [3])">=");
  mainProgram(&local_70,this);
  Node::operator=(&this->root,&local_70);
  Node::~Node(&local_70);
  return;
}

Assistant:

Lexical(const Parsing &parsing_) {
		parsing = parsing_;
		words = parsing_.words;
		words.emplace_back(Word("", 0, 0, 0, 0));
		wordIndex = -1;
		nodeCnt = 0;
		lastErrorIndex = lastErrorCode = -1;
		relationOperators.emplace_back("=");
		relationOperators.emplace_back("#");
		relationOperators.emplace_back("<");
		relationOperators.emplace_back("<=");
		relationOperators.emplace_back(">");
		relationOperators.emplace_back(">=");

		root = mainProgram();
	}